

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

SQBool __thiscall RefTable::Release(RefTable *this,SQObject *obj)

{
  SQUnsignedInteger *pSVar1;
  RefNode *this_00;
  RefNode **ppRVar2;
  SQBool SVar3;
  SQObjectPtr o;
  RefNode *prev;
  SQHash mainpos;
  
  SVar3 = 0;
  this_00 = Get(this,obj,&mainpos,&prev,false);
  if (this_00 != (RefNode *)0x0) {
    pSVar1 = &this_00->refs;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      o.super_SQObject._type = (this_00->obj).super_SQObject._type;
      o.super_SQObject._flags = (this_00->obj).super_SQObject._flags;
      o.super_SQObject._5_3_ = *(undefined3 *)&(this_00->obj).super_SQObject.field_0x5;
      o.super_SQObject._unVal = (SQObjectValue)(this_00->obj).super_SQObject._unVal.pTable;
      if ((o.super_SQObject._0_8_ & 0x8000000) != 0) {
        pSVar1 = &((o.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      ppRVar2 = &prev->next;
      if (prev == (RefNode *)0x0) {
        ppRVar2 = this->_buckets + mainpos;
      }
      *ppRVar2 = this_00->next;
      this_00->next = this->_freelist;
      this->_freelist = this_00;
      this->_slotused = this->_slotused - 1;
      SQObjectPtr::Null(&this_00->obj);
      SQObjectPtr::~SQObjectPtr(&o);
      SVar3 = 1;
    }
    else {
      SVar3 = 0;
    }
  }
  return SVar3;
}

Assistant:

SQBool RefTable::Release(SQObject &obj)
{
    SQHash mainpos;
    RefNode *prev;
    RefNode *ref = Get(obj,mainpos,&prev,false);
    if(ref) {
        if(--ref->refs == 0) {
            SQObjectPtr o = ref->obj;
            if(prev) {
                prev->next = ref->next;
            }
            else {
                _buckets[mainpos] = ref->next;
            }
            ref->next = _freelist;
            _freelist = ref;
            _slotused--;
            ref->obj.Null();
            //<<FIXME>>test for shrink?
            return SQTrue;
        }
    }
    else {
        assert(0);
    }
    return SQFalse;
}